

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O1

void __thiscall rcdiscover::SocketLinux::enableBroadcastImpl(SocketLinux *this)

{
  int iVar1;
  SocketException *this_00;
  int *piVar2;
  int yes;
  undefined4 local_44;
  string local_40;
  
  local_44 = 1;
  iVar1 = setsockopt(this->sock_,1,6,&local_44,4);
  if (iVar1 != -1) {
    return;
  }
  this_00 = (SocketException *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Error while setting socket options","");
  piVar2 = __errno_location();
  SocketException::SocketException(this_00,&local_40,*piVar2);
  __cxa_throw(this_00,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::enableBroadcastImpl()
{
  const int yes = 1;
  if (::setsockopt(sock_,
                  SOL_SOCKET,
                  SO_BROADCAST,
                  reinterpret_cast<const char *>(&yes),
                  sizeof(yes)) == -1)
  {
    throw SocketException("Error while setting socket options", errno);
  }
}